

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

int __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,int,std::less<S2BooleanOperation::SourceId>,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,256,false>>
::binary_search_plain_compare<S2BooleanOperation::SourceId,std::less<S2BooleanOperation::SourceId>>
          (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,int,std::less<S2BooleanOperation::SourceId>,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,256,false>>
           *this,SourceId *k,int s,int e,less<S2BooleanOperation::SourceId> *comp)

{
  bool bVar1;
  int i;
  key_type *__x;
  int mid;
  less<S2BooleanOperation::SourceId> *comp_local;
  int e_local;
  int s_local;
  SourceId *k_local;
  btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
  *this_local;
  
  i = e;
  comp_local._4_4_ = s;
  while (comp_local._0_4_ = i, comp_local._4_4_ != (int)comp_local) {
    i = comp_local._4_4_ + (int)comp_local >> 1;
    __x = btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
          ::key((btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
                 *)this,i);
    bVar1 = std::less<S2BooleanOperation::SourceId>::operator()(comp,__x,k);
    if (bVar1) {
      comp_local._4_4_ = i + 1;
      i = (int)comp_local;
    }
  }
  return comp_local._4_4_;
}

Assistant:

int binary_search_plain_compare(const K &k, int s, int e,
                                  const Compare &comp) const {
    while (s != e) {
      const int mid = (s + e) >> 1;
      if (comp(key(mid), k)) {
        s = mid + 1;
      } else {
        e = mid;
      }
    }
    return s;
  }